

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O1

void * __thiscall cppcms::impl::buddy_allocator::malloc(buddy_allocator *this,size_t __size)

{
  ulong uVar1;
  ulong uVar2;
  page *ppVar3;
  byte bVar4;
  
  uVar1 = 0;
  do {
    bVar4 = (byte)uVar1;
    uVar2 = uVar1 + 1;
    if (0x3f < uVar1) break;
    uVar1 = uVar2;
  } while ((ulong)(1L << (bVar4 & 0x3f)) < (__size + 0xf & 0xfffffffffffffff0) + 0x10);
  ppVar3 = page_alloc(this,(int)uVar2 + -1);
  if (ppVar3 != (page *)0x0) {
    ppVar3 = (page *)&ppVar3->prev;
  }
  return ppVar3;
}

Assistant:

void *malloc(size_t required_size)
	{
		size_t n = ((required_size+alignment-1)/alignment + 1)*alignment;
		int bits = get_bits(n);

		
		LOG("Allocating chunk of size %zd (%d) for request of %zd",n,bits,required_size);
		page *p = page_alloc(bits);
		LOG("Got %zx",(p?(char*)(p) - memory():0));
		if(!p)
			return 0;
		void *r = reinterpret_cast<char *>(p) + alignment;
		return r;
	}